

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O0

void __thiscall
QHashPrivate::Span<QCache<QByteArray,_QOpenGLProgramBinaryCache::MemCacheEntry>::Node>::freeData
          (Span<QCache<QByteArray,_QOpenGLProgramBinaryCache::MemCacheEntry>::Node> *this)

{
  Node *pNVar1;
  Node *in_RDI;
  uchar o;
  uchar *__end4;
  uchar *__begin4;
  uchar (*__range4) [128];
  Node *local_18;
  
  if (*(long *)(in_RDI + 0x80) != 0) {
    pNVar1 = in_RDI + 0x80;
    for (local_18 = in_RDI; local_18 != pNVar1; local_18 = local_18 + 1) {
      if (*local_18 != (Node)0xff) {
        Entry::node((Entry *)(*(long *)(in_RDI + 0x80) + (ulong)(byte)*local_18 * 0x38));
        QCache<QByteArray,_QOpenGLProgramBinaryCache::MemCacheEntry>::Node::~Node(in_RDI);
      }
    }
    if (*(void **)(in_RDI + 0x80) != (void *)0x0) {
      operator_delete__(*(void **)(in_RDI + 0x80));
    }
    *(undefined8 *)(in_RDI + 0x80) = 0;
  }
  return;
}

Assistant:

void freeData() noexcept(std::is_nothrow_destructible<Node>::value)
    {
        if (entries) {
            if constexpr (!std::is_trivially_destructible<Node>::value) {
                for (auto o : offsets) {
                    if (o != SpanConstants::UnusedEntry)
                        entries[o].node().~Node();
                }
            }
            delete[] entries;
            entries = nullptr;
        }
    }